

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t match_owner_name_mbs(archive_match *a,match_list *list,char *name)

{
  wchar_t wVar1;
  int iVar2;
  int *piVar3;
  char *local_38;
  char *p;
  match *m;
  char *name_local;
  match_list *list_local;
  archive_match *a_local;
  
  if ((name != (char *)0x0) && (*name != '\0')) {
    m = (match *)name;
    name_local = (char *)list;
    list_local = (match_list *)a;
    for (p = (char *)list->first; p != (char *)0x0; p = *(char **)p) {
      wVar1 = archive_mstring_get_mbs((archive *)list_local,(archive_mstring *)(p + 0x10),&local_38)
      ;
      if ((wVar1 < L'\0') && (piVar3 = __errno_location(), *piVar3 == 0xc)) {
        wVar1 = error_nomem((archive_match *)list_local);
        return wVar1;
      }
      if ((local_38 != (char *)0x0) && (iVar2 = strcmp(local_38,(char *)m), iVar2 == 0)) {
        *(int *)(p + 8) = *(int *)(p + 8) + 1;
        return L'\x01';
      }
    }
  }
  return L'\0';
}

Assistant:

static int
match_owner_name_mbs(struct archive_match *a, struct match_list *list,
    const char *name)
{
	struct match *m;
	const char *p;

	if (name == NULL || *name == '\0')
		return (0);
	for (m = list->first; m; m = m->next) {
		if (archive_mstring_get_mbs(&(a->archive), &(m->pattern), &p)
		    < 0 && errno == ENOMEM)
			return (error_nomem(a));
		if (p != NULL && strcmp(p, name) == 0) {
			m->matches++;
			return (1);
		}
	}
	return (0);
}